

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpegtexture.cpp
# Opt level: O0

int __thiscall
FJPEGTexture::CopyTrueColorPixels
          (FJPEGTexture *this,FBitmap *bmp,int x,int y,int rotate,FCopyInfo *inf)

{
  undefined4 *puVar1;
  void *pvVar2;
  undefined4 local_18d8 [2];
  int local_18d0;
  int local_18c8;
  undefined8 local_18c0;
  FCopyInfo *local_18b8;
  undefined4 local_18b0;
  undefined4 local_18a8;
  undefined4 local_18a0;
  undefined1 *local_1890;
  undefined1 *local_1888;
  void *local_1878;
  void *local_1870;
  undefined8 *local_1860;
  FResourceLump **local_1858;
  FJPEGTexture *local_1850;
  PalEntry *local_1848;
  FResourceLump **local_1840;
  anon_union_4_2_12391d7c_for_PalEntry_0 local_1830;
  int anon_var_0;
  long lStack_1828;
  int i;
  BYTE *ptr;
  undefined1 local_1818 [4];
  int yc;
  FLumpSourceMgr sourcemgr;
  undefined1 local_7c0 [8];
  jpeg_error_mgr jerr;
  jpeg_decompress_struct cinfo;
  JSAMPLE *buff;
  FWadLump lump;
  PalEntry pe [256];
  FCopyInfo *inf_local;
  int rotate_local;
  int y_local;
  int x_local;
  FBitmap *bmp_local;
  FJPEGTexture *this_local;
  
  local_1840 = &lump.Lump;
  local_1848 = pe + 0xfe;
  local_1850 = this;
  do {
    local_1858 = local_1840;
    PalEntry::PalEntry((PalEntry *)local_1840);
    local_1840 = (FResourceLump **)((long)local_1858 + 4);
  } while ((PalEntry *)local_1840 != local_1848);
  FWadCollection::OpenLumpNum((FWadLump *)&buff,&Wads,(local_1850->super_FTexture).SourceLump);
  local_1860 = (undefined8 *)jpeg_std_error(local_7c0);
  local_1860[2] = JPEG_OutputMessage;
  *local_1860 = JPEG_ErrorExit;
  jerr._160_8_ = local_1860;
  jpeg_CreateDecompress(&jerr.first_addon_message,0x50,0x290);
  FLumpSourceMgr::FLumpSourceMgr
            ((FLumpSourceMgr *)local_1818,(FileReader *)&buff,
             (j_decompress_ptr)&jerr.first_addon_message);
  jpeg_read_header(&jerr.first_addon_message,1);
  if ((((cinfo.num_components != 2) || (cinfo.image_width != 3)) &&
      ((cinfo.num_components != 4 || (cinfo.image_width != 4)))) &&
     ((cinfo.num_components != 1 || (cinfo.image_width != 1)))) {
    Printf("\x1cIUnsupported color format\n");
    puVar1 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar1 = 0xffffffff;
    __cxa_throw(puVar1,&int::typeinfo,0);
  }
  jpeg_start_decompress(&jerr.first_addon_message);
  ptr._4_4_ = 0;
  pvVar2 = operator_new__((ulong)(cinfo.enable_2pass_quant * cinfo.enable_external_quant *
                                 cinfo.output_height));
  local_1878 = pvVar2;
  while ((uint)cinfo.colormap < (uint)cinfo.enable_2pass_quant) {
    lStack_1828 = (long)pvVar2 +
                  (ulong)(cinfo.enable_external_quant * cinfo.output_height * ptr._4_4_);
    jpeg_read_scanlines(&jerr.first_addon_message,&stack0xffffffffffffe7d8,1);
    ptr._4_4_ = ptr._4_4_ + 1;
  }
  local_18c8 = rotate;
  local_18b8 = inf;
  if (cinfo.num_components == 1) {
    for (anon_var_0 = 0; anon_var_0 < 0x100; anon_var_0 = anon_var_0 + 1) {
      PalEntry::PalEntry((PalEntry *)&local_1830.field_0,0xff,(BYTE)anon_var_0,(BYTE)anon_var_0,
                         (BYTE)anon_var_0);
      pe[(long)anon_var_0 + -2].field_0 = local_1830;
    }
    local_18c0 = &lump.Lump;
    local_18d0 = cinfo.enable_external_quant;
    local_18d8[0] = 1;
    (*bmp->_vptr_FBitmap[3])
              (bmp,(ulong)(uint)x,(ulong)(uint)y,pvVar2,(ulong)(uint)cinfo.enable_external_quant,
               (ulong)(uint)cinfo.enable_2pass_quant);
  }
  else if (cinfo.num_components == 2) {
    local_18d0 = cinfo.enable_external_quant * cinfo.output_height;
    local_18a0 = 0;
    local_18a8 = 0;
    local_18b0 = 0;
    local_18c0 = (FResourceLump **)((ulong)local_18c0._4_4_ << 0x20);
    local_18d8[0] = 3;
    local_1888 = (undefined1 *)local_18d8;
    (*bmp->_vptr_FBitmap[2])
              (bmp,(ulong)(uint)x,(ulong)(uint)y,pvVar2,(ulong)(uint)cinfo.enable_external_quant,
               (ulong)(uint)cinfo.enable_2pass_quant);
  }
  else {
    if (cinfo.num_components != 4) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/textures/jpegtexture.cpp"
                    ,0x210,
                    "virtual int FJPEGTexture::CopyTrueColorPixels(FBitmap *, int, int, int, FCopyInfo *)"
                   );
    }
    local_18d0 = cinfo.enable_external_quant * cinfo.output_height;
    local_18a0 = 0;
    local_18a8 = 0;
    local_18b0 = 0;
    local_18c0 = (FResourceLump **)CONCAT44(local_18c0._4_4_,4);
    local_18d8[0] = 4;
    local_1890 = (undefined1 *)local_18d8;
    (*bmp->_vptr_FBitmap[2])
              (bmp,(ulong)(uint)x,(ulong)(uint)y,pvVar2,(ulong)(uint)cinfo.enable_external_quant,
               (ulong)(uint)cinfo.enable_2pass_quant);
  }
  jpeg_finish_decompress(&jerr.first_addon_message);
  jpeg_destroy_decompress(&jerr.first_addon_message);
  if ((pvVar2 != (void *)0x0) && (local_1870 = pvVar2, pvVar2 != (void *)0x0)) {
    operator_delete__(pvVar2);
  }
  FWadLump::~FWadLump((FWadLump *)&buff);
  return 0;
}

Assistant:

int FJPEGTexture::CopyTrueColorPixels(FBitmap *bmp, int x, int y, int rotate, FCopyInfo *inf)
{
	PalEntry pe[256];

	FWadLump lump = Wads.OpenLumpNum (SourceLump);
	JSAMPLE *buff = NULL;

	jpeg_decompress_struct cinfo;
	jpeg_error_mgr jerr;

	cinfo.err = jpeg_std_error(&jerr);
	cinfo.err->output_message = JPEG_OutputMessage;
	cinfo.err->error_exit = JPEG_ErrorExit;
	jpeg_create_decompress(&cinfo);

	try
	{
		FLumpSourceMgr sourcemgr(&lump, &cinfo);
		jpeg_read_header(&cinfo, TRUE);

		if (!((cinfo.out_color_space == JCS_RGB && cinfo.num_components == 3) ||
			  (cinfo.out_color_space == JCS_CMYK && cinfo.num_components == 4) ||
			  (cinfo.out_color_space == JCS_GRAYSCALE && cinfo.num_components == 1)))
		{
			Printf (TEXTCOLOR_ORANGE "Unsupported color format\n");
			throw -1;
		}
		jpeg_start_decompress(&cinfo);

		int yc = 0;
		buff = new BYTE[cinfo.output_height * cinfo.output_width * cinfo.output_components];


		while (cinfo.output_scanline < cinfo.output_height)
		{
			BYTE * ptr = buff + cinfo.output_width * cinfo.output_components * yc;
			jpeg_read_scanlines(&cinfo, &ptr, 1);
			yc++;
		}

		switch (cinfo.out_color_space)
		{
		case JCS_RGB:
			bmp->CopyPixelDataRGB(x, y, buff, cinfo.output_width, cinfo.output_height, 
				3, cinfo.output_width * cinfo.output_components, rotate, CF_RGB, inf);
			break;

		case JCS_GRAYSCALE:
			for(int i=0;i<256;i++) pe[i]=PalEntry(255,i,i,i);	// default to a gray map
			bmp->CopyPixelData(x, y, buff, cinfo.output_width, cinfo.output_height, 
				1, cinfo.output_width, rotate, pe, inf);
			break;

		case JCS_CMYK:
			bmp->CopyPixelDataRGB(x, y, buff, cinfo.output_width, cinfo.output_height, 
				4, cinfo.output_width * cinfo.output_components, rotate, CF_CMYK, inf);
			break;

		default:
			assert(0);
			break;
		}
		jpeg_finish_decompress(&cinfo);
	}
	catch(int)
	{
		Printf (TEXTCOLOR_ORANGE "   in JPEG texture %s\n", Name.GetChars());
	}
	jpeg_destroy_decompress(&cinfo);
	if (buff != NULL) delete [] buff;
	return 0;
}